

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cea708.c
# Opt level: O0

int cea708_render(cea708_t *cea708,uint8_t *data,size_t size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  size_t total;
  int i;
  size_t size_local;
  uint8_t *data_local;
  cea708_t *cea708_local;
  
  *data = (uint8_t)cea708->country;
  data[1] = (uint8_t)(cea708->provider >> 8);
  data[2] = (uint8_t)cea708->provider;
  total = 3;
  data_local = data + 3;
  if (cea708->provider == t35_provider_atsc) {
    *data_local = (uint8_t)(cea708->user_identifier >> 0x18);
    data[4] = (uint8_t)(cea708->user_identifier >> 0x10);
    data[5] = (uint8_t)(cea708->user_identifier >> 8);
    data[6] = (uint8_t)cea708->user_identifier;
    total = 7;
    data_local = data + 7;
  }
  if ((cea708->provider == t35_provider_atsc) || (cea708->provider == t35_provider_direct_tv)) {
    *data_local = cea708->user_data_type_code;
    total = total + 1;
    data_local = data_local + 1;
  }
  if (cea708->provider == t35_provider_direct_tv) {
    *data_local = cea708->directv_user_data_length;
    total = total + 1;
    data_local = data_local + 1;
  }
  data_local[1] = (uint8_t)((ushort)*(undefined2 *)&cea708->user_data >> 8);
  bVar1 = 0;
  if ((undefined1  [132])((undefined1  [132])cea708->user_data & (undefined1  [132])0x1) !=
      (undefined1  [132])0x0) {
    bVar1 = 0x80;
  }
  bVar2 = 0;
  if ((*(ushort *)&cea708->user_data >> 1 & 1) != 0) {
    bVar2 = 0x40;
  }
  bVar3 = 0;
  if ((*(ushort *)&cea708->user_data >> 2 & 1) != 0) {
    bVar3 = 0x20;
  }
  *data_local = bVar1 | bVar2 | bVar3 | (byte)(*(ushort *)&cea708->user_data >> 3) & 0x1f;
  total = total + 2;
  data_local = data_local + 2;
  for (i = 0; i < (int)(uint)(*(ushort *)&cea708->user_data >> 3 & 0x1f); i = i + 1) {
    *data_local = (byte)(((uint)(cea708->user_data).cc_data[i] & 0x1f) << 3) |
                  (byte)(((uint)(cea708->user_data).cc_data[i] >> 5 & 1) << 2) |
                  (byte)((uint)(cea708->user_data).cc_data[i] >> 6) & 3;
    data_local[1] = SUB41((cea708->user_data).cc_data[i],2);
    data_local[2] = SUB41((cea708->user_data).cc_data[i],1);
    total = total + 3;
    data_local = data_local + 3;
  }
  *data_local = 0xff;
  return (int)total + 1;
}

Assistant:

int cea708_render(cea708_t* cea708, uint8_t* data, size_t size)
{
    int i;
    size_t total = 0;
    data[0] = cea708->country;
    data[1] = cea708->provider >> 8;
    data[2] = cea708->provider >> 0;
    total += 3;
    data += 3;
    size -= 3;

    if (t35_provider_atsc == cea708->provider) {

        data[0] = cea708->user_identifier >> 24;
        data[1] = cea708->user_identifier >> 16;
        data[2] = cea708->user_identifier >> 8;
        data[3] = cea708->user_identifier >> 0;
        total += 4;
        data += 4;
        size -= 4;
    }

    if (t35_provider_atsc == cea708->provider || t35_provider_direct_tv == cea708->provider) {
        data[0] = cea708->user_data_type_code;
        total += 1;
        data += 1;
        size -= 1;
    }

    if (t35_provider_direct_tv == cea708->provider) {
        data[0] = cea708->directv_user_data_length;
        total += 1;
        data += 1;
        size -= 1;
    }

    data[1] = cea708->user_data.em_data;
    data[0] = (cea708->user_data.process_em_data_flag ? 0x80 : 0x00)
        | (cea708->user_data.process_cc_data_flag ? 0x40 : 0x00)
        | (cea708->user_data.additional_data_flag ? 0x20 : 0x00)
        | (cea708->user_data.cc_count & 0x1F);

    total += 2;
    data += 2;
    size -= 2;

    for (i = 0; i < (int)cea708->user_data.cc_count; ++i) {
        data[0] = (cea708->user_data.cc_data[i].marker_bits << 3) | (cea708->user_data.cc_data[i].cc_valid << 2) | cea708->user_data.cc_data[i].cc_type;
        data[1] = cea708->user_data.cc_data[i].cc_data >> 8;
        data[2] = cea708->user_data.cc_data[i].cc_data >> 0;
        total += 3;
        data += 3;
        size -= 3;
    }

    data[0] = 0xFF; //marker bits
    return (int)(total + 1);
}